

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::StandardRsCaseItemSyntax::StandardRsCaseItemSyntax
          (StandardRsCaseItemSyntax *this,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *expressions,Token colon,
          RsProdItemSyntax *item,Token semi)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  ExpressionSyntax *pEVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  iterator_base<slang::syntax::ExpressionSyntax_*> local_30;
  
  uVar5 = colon._0_8_;
  (this->super_RsCaseItemSyntax).super_SyntaxNode.kind = StandardRsCaseItem;
  (this->super_RsCaseItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_RsCaseItemSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar3 = *(undefined4 *)&(expressions->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (expressions->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.kind =
       (expressions->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->expressions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (expressions->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->expressions).super_SyntaxListBase.childCount =
       (expressions->super_SyntaxListBase).childCount;
  (this->expressions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0057e1d8;
  sVar1 = (expressions->elements)._M_extent._M_extent_value;
  (this->expressions).elements._M_ptr = (expressions->elements)._M_ptr;
  (this->expressions).elements._M_extent._M_extent_value = sVar1;
  (this->colon).kind = (short)uVar5;
  (this->colon).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->colon).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->colon).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->colon).info = colon.info;
  (this->item).ptr = item;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_30.index = 0;
  sVar1 = (this->expressions).elements._M_extent._M_extent_value;
  local_30.list = &this->expressions;
  for (; (local_30.list != &this->expressions || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pEVar4 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<slang::syntax::ExpressionSyntax_*>::dereference(&local_30);
    (pEVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (((this->item).ptr)->super_RsProdSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  return;
}

Assistant:

StandardRsCaseItemSyntax(const SeparatedSyntaxList<ExpressionSyntax>& expressions, Token colon, RsProdItemSyntax& item, Token semi) :
        RsCaseItemSyntax(SyntaxKind::StandardRsCaseItem), expressions(expressions), colon(colon), item(&item), semi(semi) {
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
        this->item->parent = this;
    }